

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O3

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::resize(raw_hash_set<phmap::priv::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *this,size_t new_capacity)

{
  slot_type *psVar1;
  size_t capacity;
  pointer pcVar2;
  undefined1 auVar3 [16];
  undefined8 uVar4;
  size_t sVar5;
  size_t i;
  slot_type *psVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  size_t sVar8;
  FindInfo FVar9;
  Layout LVar10;
  hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_39;
  ctrl_t *local_38;
  
  if ((new_capacity != 0) && ((new_capacity + 1 & new_capacity) == 0)) {
    local_38 = this->ctrl_;
    psVar1 = this->slots_;
    capacity = this->capacity_;
    initialize_slots(this,new_capacity);
    this->capacity_ = new_capacity;
    if (capacity != 0) {
      paVar7 = &psVar1->field_2;
      sVar8 = 0;
      do {
        if (-1 < local_38[sVar8]) {
          sVar5 = std::
                  hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator()(&local_39,(string *)(paVar7 + -1));
          auVar3._8_8_ = 0;
          auVar3._0_8_ = sVar5;
          sVar5 = SUB168(auVar3 * ZEXT816(0xde5fb9d2630458e9),8) +
                  SUB168(auVar3 * ZEXT816(0xde5fb9d2630458e9),0);
          FVar9 = find_first_non_full(this,sVar5);
          i = FVar9.offset;
          set_ctrl(this,i,(byte)sVar5 & 0x7f);
          psVar1 = this->slots_ + i;
          psVar6 = this->slots_ + i;
          (psVar6->_M_dataplus)._M_p = (pointer)&psVar6->field_2;
          pcVar2 = (((slot_type *)(paVar7 + -1))->_M_dataplus)._M_p;
          if (paVar7 == (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)pcVar2) {
            uVar4 = *(undefined8 *)((long)paVar7 + 8);
            (psVar6->field_2)._M_allocated_capacity = paVar7->_M_allocated_capacity;
            *(undefined8 *)((long)&psVar6->field_2 + 8) = uVar4;
          }
          else {
            (psVar1->_M_dataplus)._M_p = pcVar2;
            (psVar1->field_2)._M_allocated_capacity = paVar7->_M_allocated_capacity;
          }
          psVar1->_M_string_length = *(size_type *)((long)paVar7 + -8);
          (((slot_type *)(paVar7 + -1))->_M_dataplus)._M_p = (pointer)paVar7;
          *(size_type *)((long)paVar7 + -8) = 0;
          paVar7->_M_local_buf[0] = '\0';
        }
        sVar8 = sVar8 + 1;
        paVar7 = paVar7 + 2;
      } while (capacity != sVar8);
      LVar10 = MakeLayout(capacity);
      Deallocate<8ul,phmap::priv::Alloc<std::__cxx11::string>>
                ((Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&this->settings_,local_38,
                 LVar10.
                 super_LayoutType<sizeof___(Ts),_signed_char,_std::__cxx11::basic_string<char>_>.
                 size_[1] * 0x20 +
                 (LVar10.
                  super_LayoutType<sizeof___(Ts),_signed_char,_std::__cxx11::basic_string<char>_>.
                  size_[0] + 7 & 0xfffffffffffffff8));
    }
    return;
  }
  __assert_fail("IsValidCapacity(new_capacity)",
                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                ,0x807,
                "void phmap::priv::raw_hash_set<phmap::priv::FlatHashSetPolicy<std::basic_string<char>>, phmap::priv::StatefulTestingHash, phmap::priv::StatefulTestingEqual, phmap::priv::Alloc<std::basic_string<char>>>::resize(size_t) [Policy = phmap::priv::FlatHashSetPolicy<std::basic_string<char>>, Hash = phmap::priv::StatefulTestingHash, Eq = phmap::priv::StatefulTestingEqual, Alloc = phmap::priv::Alloc<std::basic_string<char>>]"
               );
}

Assistant:

inline bool IsValidCapacity(size_t n) { return ((n + 1) & n) == 0 && n > 0; }